

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  RK_S32 RVar1;
  MpiDecTestCmd *cmd;
  MpiDecTestCmd cmd_ctx;
  MpiDecTestCmd MStack_278;
  
  memset(&MStack_278,0,0x260);
  MStack_278.format = MPP_FMT_BUTT;
  MStack_278.pkt_size = 0x1000;
  RVar1 = mpi_dec_test_cmd_init(&MStack_278,argc,argv);
  if (RVar1 == 0) {
    mpi_dec_test_cmd_options(&MStack_278);
    RVar1 = dec_decode(&MStack_278);
    if (RVar1 == 0) {
      RVar1 = 0;
      _mpp_log_l((double)((float)MStack_278.max_usage * 9.536743e-07),4,"mpi_dec_test",
                 "test success max memory %.2f MB\n",0);
    }
    else {
      _mpp_log_l(2,"mpi_dec_test","test failed ret %d\n",0,RVar1);
    }
  }
  mpi_dec_test_cmd_deinit(&MStack_278);
  return RVar1;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    MpiDecTestCmd  cmd_ctx;
    MpiDecTestCmd* cmd = &cmd_ctx;

    memset((void*)cmd, 0, sizeof(*cmd));
    cmd->format = MPP_FMT_BUTT;
    cmd->pkt_size = MPI_DEC_STREAM_SIZE;

    // parse the cmd option
    ret = mpi_dec_test_cmd_init(cmd, argc, argv);
    if (ret)
        goto RET;

    mpi_dec_test_cmd_options(cmd);

    ret = dec_decode(cmd);
    if (MPP_OK == ret)
        mpp_log("test success max memory %.2f MB\n", cmd->max_usage / (float)(1 << 20));
    else
        mpp_err("test failed ret %d\n", ret);

RET:
    mpi_dec_test_cmd_deinit(cmd);

    return ret;
}